

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentUniformTexelBuffer::submit
          (RenderFragmentUniformTexelBuffer *this,SubmitContext *context)

{
  VkCommandBuffer pVVar1;
  DeviceInterface *pDVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pHVar8;
  anon_struct_12_3_59eec259 callParams;
  
  pVVar1 = context->m_commandBuffer;
  pDVar2 = context->m_context->m_context->m_vkd;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,pVVar1,0,
             (this->m_resources).pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
             object.m_internal);
  pHVar8 = (this->m_descriptorSets).
           super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->m_descriptorSets).
                super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8;
  if (lVar4 != 0) {
    uVar5 = lVar4 >> 3;
    lVar4 = 0;
    uVar7 = 0;
    do {
      callParams.callId = (deUint32)uVar7;
      uVar3 = this->m_bufferSize >> 2;
      callParams.maxUniformTexelCount = this->m_maxUniformTexelCount;
      if (callParams.maxUniformTexelCount <= uVar3) {
        uVar3 = (ulong)callParams.maxUniformTexelCount;
      }
      uVar6 = this->m_targetHeight * this->m_targetWidth;
      callParams.valuesPerPixel =
           ((int)((uVar3 * uVar5) / uVar6) + 1) - (uint)((uVar3 * uVar5) % uVar6 == 0);
      (*pDVar2->_vptr_DeviceInterface[0x56])
                (pDVar2,pVVar1,0,
                 (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                 m_data.object.m_internal,0,1,(long)&pHVar8->m_internal + lVar4,0,0);
      (*pDVar2->_vptr_DeviceInterface[0x73])
                (pDVar2,pVVar1,
                 (this->m_resources).pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.
                 m_data.object.m_internal,0x10,0,0xc,&callParams);
      (*pDVar2->_vptr_DeviceInterface[0x59])(pDVar2,pVVar1,6,1,0,0);
      uVar7 = uVar7 + 1;
      pHVar8 = (this->m_descriptorSets).
               super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(this->m_descriptorSets).
                    super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar8 >> 3;
      lVar4 = lVar4 + 8;
    } while (uVar7 < uVar5);
  }
  return;
}

Assistant:

void RenderFragmentUniformTexelBuffer::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd				= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	commandBuffer	= context.getCommandBuffer();

	vkd.cmdBindPipeline(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipeline);

	for (size_t descriptorSetNdx = 0; descriptorSetNdx < m_descriptorSets.size(); descriptorSetNdx++)
	{
		const struct
		{
			const deUint32	callId;
			const deUint32	valuesPerPixel;
			const deUint32	maxUniformTexelCount;
		} callParams =
		{
			(deUint32)descriptorSetNdx,
			(deUint32)divRoundUp<size_t>(m_descriptorSets.size() * de::min<size_t>((size_t)m_bufferSize / 4, m_maxUniformTexelCount), m_targetWidth * m_targetHeight),
			m_maxUniformTexelCount
		};

		vkd.cmdBindDescriptorSets(commandBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_resources.pipelineLayout, 0u, 1u, &m_descriptorSets[descriptorSetNdx], 0u, DE_NULL);
		vkd.cmdPushConstants(commandBuffer, *m_resources.pipelineLayout, vk::VK_SHADER_STAGE_FRAGMENT_BIT, 0u, (deUint32)sizeof(callParams), &callParams);
		vkd.cmdDraw(commandBuffer, 6, 1, 0, 0);
	}
}